

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,ExtPubkey *ext_pubkey,string *arg)

{
  pointer pcVar1;
  pointer puVar2;
  uint32_t uVar3;
  uint8_t uVar4;
  undefined3 uVar5;
  uint32_t uVar6;
  SchnorrPubkey local_58;
  ExtPrivkey *local_40;
  SchnorrPubkey *local_38;
  
  this->key_type_ = kDescriptorKeyBip32;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  local_38 = &this->schnorr_pubkey_;
  ExtPubkey::GetPubkey(&this->pubkey_,ext_pubkey);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  local_40 = &this->extprivkey_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ext_pubkey);
  uVar3 = ext_pubkey->fingerprint_;
  uVar4 = ext_pubkey->depth_;
  uVar5 = *(undefined3 *)&ext_pubkey->field_0x21;
  uVar6 = ext_pubkey->child_num_;
  (this->extpubkey_).version_ = ext_pubkey->version_;
  (this->extpubkey_).fingerprint_ = uVar3;
  (this->extpubkey_).depth_ = uVar4;
  *(undefined3 *)&(this->extpubkey_).field_0x21 = uVar5;
  (this->extpubkey_).child_num_ = uVar6;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extpubkey_).chaincode_.data_,&(ext_pubkey->chaincode_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ext_pubkey->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extpubkey_).tweak_sum_.data_,&(ext_pubkey->tweak_sum_).data_);
  KeyData::KeyData(&this->key_data_);
  (this->argument_)._M_dataplus._M_p = (pointer)&(this->argument_).field_2;
  if (arg == (string *)0x0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->argument_,"");
  }
  else {
    pcVar1 = (arg->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&this->argument_,pcVar1,pcVar1 + arg->_M_string_length);
  }
  SchnorrPubkey::FromPubkey(&local_58,&this->pubkey_,(bool *)0x0);
  puVar2 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const ExtPubkey& ext_pubkey, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32),
      pubkey_(ext_pubkey.GetPubkey()),
      extpubkey_(ext_pubkey),
      argument_((arg) ? *arg : "") {
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}